

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PrimRectUV(ImDrawList *this,ImVec2 *a,ImVec2 *c,ImVec2 *uv_a,ImVec2 *uv_c,ImU32 col)

{
  ImDrawIdx IVar1;
  ImVec2 IStack_54;
  ImDrawIdx idx;
  ImVec2 uv_d;
  ImVec2 uv_b;
  ImVec2 d;
  ImVec2 b;
  ImU32 col_local;
  ImVec2 *uv_c_local;
  ImVec2 *uv_a_local;
  ImVec2 *c_local;
  ImVec2 *a_local;
  ImDrawList *this_local;
  
  ImVec2::ImVec2(&d,c->x,a->y);
  ImVec2::ImVec2(&uv_b,a->x,c->y);
  ImVec2::ImVec2(&uv_d,uv_c->x,uv_a->y);
  ImVec2::ImVec2(&stack0xffffffffffffffac,uv_a->x,uv_c->y);
  IVar1 = (ImDrawIdx)this->_VtxCurrentIdx;
  *this->_IdxWritePtr = IVar1;
  this->_IdxWritePtr[1] = IVar1 + 1;
  this->_IdxWritePtr[2] = IVar1 + 2;
  this->_IdxWritePtr[3] = IVar1;
  this->_IdxWritePtr[4] = IVar1 + 2;
  this->_IdxWritePtr[5] = IVar1 + 3;
  this->_VtxWritePtr->pos = *a;
  this->_VtxWritePtr->uv = *uv_a;
  this->_VtxWritePtr->col = col;
  this->_VtxWritePtr[1].pos = d;
  this->_VtxWritePtr[1].uv = uv_d;
  this->_VtxWritePtr[1].col = col;
  this->_VtxWritePtr[2].pos = *c;
  this->_VtxWritePtr[2].uv = *uv_c;
  this->_VtxWritePtr[2].col = col;
  this->_VtxWritePtr[3].pos = uv_b;
  this->_VtxWritePtr[3].uv = IStack_54;
  this->_VtxWritePtr[3].col = col;
  this->_VtxWritePtr = this->_VtxWritePtr + 4;
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
  this->_IdxWritePtr = this->_IdxWritePtr + 6;
  return;
}

Assistant:

void ImDrawList::PrimRectUV(const ImVec2& a, const ImVec2& c, const ImVec2& uv_a, const ImVec2& uv_c, ImU32 col)
{
    ImVec2 b(c.x, a.y), d(a.x, c.y), uv_b(uv_c.x, uv_a.y), uv_d(uv_a.x, uv_c.y);
    ImDrawIdx idx = (ImDrawIdx)_VtxCurrentIdx;
    _IdxWritePtr[0] = idx; _IdxWritePtr[1] = (ImDrawIdx)(idx+1); _IdxWritePtr[2] = (ImDrawIdx)(idx+2);
    _IdxWritePtr[3] = idx; _IdxWritePtr[4] = (ImDrawIdx)(idx+2); _IdxWritePtr[5] = (ImDrawIdx)(idx+3);
    _VtxWritePtr[0].pos = a; _VtxWritePtr[0].uv = uv_a; _VtxWritePtr[0].col = col;
    _VtxWritePtr[1].pos = b; _VtxWritePtr[1].uv = uv_b; _VtxWritePtr[1].col = col;
    _VtxWritePtr[2].pos = c; _VtxWritePtr[2].uv = uv_c; _VtxWritePtr[2].col = col;
    _VtxWritePtr[3].pos = d; _VtxWritePtr[3].uv = uv_d; _VtxWritePtr[3].col = col;
    _VtxWritePtr += 4;
    _VtxCurrentIdx += 4;
    _IdxWritePtr += 6;
}